

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

ScanResult * __thiscall
wallet::CWallet::ScanForWalletTransactions
          (ScanResult *__return_storage_ptr__,CWallet *this,uint256 *start_block,int start_height,
          optional<int> max_height,WalletRescanReserver *reserver,bool fUpdate,bool save_progress)

{
  uint256 *puVar1;
  _Hashtable<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::__detail::_Identity,_std::equal_to<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_ByteVectorHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *this_00;
  NowFn *pNVar2;
  signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_boost::function<void_(const_boost::signals2::connection_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_boost::signals2::mutex>
  *this_01;
  RecursiveMutex *pRVar3;
  long lVar4;
  _Rb_tree_node_base *p_Var5;
  map<uint256,_int,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_int>_>_> *this_02;
  uchar *puVar6;
  long lVar7;
  Chain *pCVar8;
  long *plVar9;
  WalletDatabase *pWVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  base_blob<256U> *pbVar17;
  unique_ptr<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
  uVar18;
  bool bVar19;
  int iVar20;
  int32_t iVar21;
  uint uVar22;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tVar23;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tVar24;
  unique_ptr<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
  uVar25;
  _Rb_tree<uint256,std::pair<uint256_const,int>,std::_Select1st<std::pair<uint256_const,int>>,std::less<uint256>,std::allocator<std::pair<uint256_const,int>>>
  *this_03;
  DescriptorScriptPubKeyMan *pDVar26;
  _Rb_tree_node_base *p_Var27;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar28;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tVar29;
  rep extraout_RAX;
  ScriptPubKeyMan *pSVar30;
  mapped_type_conflict3 *pmVar31;
  Logger *pLVar32;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar33;
  long lVar34;
  char *fmt;
  CTransactionRef *ptx;
  ulong uVar35;
  pointer __p;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar36;
  double dVar37;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  ScanResult *args;
  char cVar38;
  undefined4 in_stack_fffffffffffffda0;
  undefined4 uVar39;
  undefined4 in_stack_fffffffffffffda4;
  undefined4 uVar40;
  undefined4 uVar41;
  undefined4 in_stack_fffffffffffffdac;
  undefined4 uVar42;
  _Optional_payload_base<int> _Var43;
  WalletBatch batch;
  bool next_block;
  bool block_still_active;
  int block_height;
  unique_ptr<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
  fast_rescan_filter;
  CBlock block;
  CBlockLocator loc;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock43;
  undefined1 local_e8 [16];
  uint256 next_block_hash;
  uint256 end_hash;
  uint256 tip_hash;
  string local_78;
  uint256 block_hash;
  
  lVar7 = *(long *)(in_FS_OFFSET + 0x28);
  if ((reserver->m_now).super__Function_base._M_manager == (_Manager_type)0x0) {
    tVar23.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  }
  else {
    tVar23 = (*(reserver->m_now)._M_invoker)((_Any_data *)&reserver->m_now);
  }
  if ((reserver->m_now).super__Function_base._M_manager == (_Manager_type)0x0) {
    tVar24.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  }
  else {
    tVar24 = (*(reserver->m_now)._M_invoker)((_Any_data *)&reserver->m_now);
  }
  this_03 = (_Rb_tree<uint256,std::pair<uint256_const,int>,std::_Select1st<std::pair<uint256_const,int>>,std::less<uint256>,std::allocator<std::pair<uint256_const,int>>>
             *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0);
  if ((reserver->m_could_reserve != true) ||
     (((reserver->m_wallet->fScanningWallet)._M_base._M_i & 1U) == 0)) {
    __assert_fail("reserver.isReserved()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
                  ,0x75a,
                  "CWallet::ScanResult wallet::CWallet::ScanForWalletTransactions(const uint256 &, int, std::optional<int>, const WalletRescanReserver &, bool, const bool)"
                 );
  }
  block_hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
       *(undefined8 *)(start_block->super_base_blob<256U>).m_data._M_elems;
  block_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       *(undefined8 *)((start_block->super_base_blob<256U>).m_data._M_elems + 8);
  block_hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
       *(undefined8 *)((start_block->super_base_blob<256U>).m_data._M_elems + 0x10);
  block_hash.super_base_blob<256U>.m_data._M_elems._24_8_ =
       *(undefined8 *)((start_block->super_base_blob<256U>).m_data._M_elems + 0x18);
  (__return_storage_ptr__->last_scanned_height).super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int>._M_engaged = false;
  puVar1 = &__return_storage_ptr__->last_failed_block;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[8] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[9] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[10] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[0xb] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[0xc] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[0xd] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[0xe] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[0xf] = '\0';
  pbVar17 = &(__return_storage_ptr__->last_failed_block).super_base_blob<256U>;
  (pbVar17->m_data)._M_elems[0x10] = '\0';
  (pbVar17->m_data)._M_elems[0x11] = '\0';
  (pbVar17->m_data)._M_elems[0x12] = '\0';
  (pbVar17->m_data)._M_elems[0x13] = '\0';
  (pbVar17->m_data)._M_elems[0x14] = '\0';
  (pbVar17->m_data)._M_elems[0x15] = '\0';
  (pbVar17->m_data)._M_elems[0x16] = '\0';
  (pbVar17->m_data)._M_elems[0x17] = '\0';
  (pbVar17->m_data)._M_elems[0x18] = '\0';
  (pbVar17->m_data)._M_elems[0x19] = '\0';
  (pbVar17->m_data)._M_elems[0x1a] = '\0';
  (pbVar17->m_data)._M_elems[0x1b] = '\0';
  (pbVar17->m_data)._M_elems[0x1c] = '\0';
  (pbVar17->m_data)._M_elems[0x1d] = '\0';
  (pbVar17->m_data)._M_elems[0x1e] = '\0';
  (pbVar17->m_data)._M_elems[0x1f] = '\0';
  __return_storage_ptr__->status = SUCCESS;
  (__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems[0] = '\0';
  (__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems[1] = '\0';
  (__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems[2] = '\0';
  (__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems[3] = '\0';
  (__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems[4] = '\0';
  (__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems[5] = '\0';
  (__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems[6] = '\0';
  (__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems[7] = '\0';
  (__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems[8] = '\0';
  (__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems[9] = '\0';
  (__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems[10] = '\0';
  (__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  pbVar17 = &(__return_storage_ptr__->last_scanned_block).super_base_blob<256U>;
  (pbVar17->m_data)._M_elems[0xc] = '\0';
  (pbVar17->m_data)._M_elems[0xd] = '\0';
  (pbVar17->m_data)._M_elems[0xe] = '\0';
  (pbVar17->m_data)._M_elems[0xf] = '\0';
  (pbVar17->m_data)._M_elems[0x10] = '\0';
  (pbVar17->m_data)._M_elems[0x11] = '\0';
  (pbVar17->m_data)._M_elems[0x12] = '\0';
  (pbVar17->m_data)._M_elems[0x13] = '\0';
  (pbVar17->m_data)._M_elems[0x14] = '\0';
  (pbVar17->m_data)._M_elems[0x15] = '\0';
  (pbVar17->m_data)._M_elems[0x16] = '\0';
  (pbVar17->m_data)._M_elems[0x17] = '\0';
  (pbVar17->m_data)._M_elems[0x18] = '\0';
  (pbVar17->m_data)._M_elems[0x19] = '\0';
  (pbVar17->m_data)._M_elems[0x1a] = '\0';
  (pbVar17->m_data)._M_elems[0x1b] = '\0';
  pbVar17 = &(__return_storage_ptr__->last_scanned_block).super_base_blob<256U>;
  (pbVar17->m_data)._M_elems[0x1c] = '\0';
  (pbVar17->m_data)._M_elems[0x1d] = '\0';
  (pbVar17->m_data)._M_elems[0x1e] = '\0';
  (pbVar17->m_data)._M_elems[0x1f] = '\0';
  fast_rescan_filter._M_t.
  super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
  ._M_t.
  super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
  .super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>.
  _M_head_impl = (__uniq_ptr_data<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>,_true,_true>
                  )(__uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                    )0x0;
  _Var43 = (_Optional_payload_base<int>)
           max_height.super__Optional_base<int,_true,_true>._M_payload.
           super__Optional_payload_base<int>;
  if (((this->m_wallet_flags).super___atomic_base<unsigned_long>._M_i >> 0x22 & 1) != 0) {
    pCVar8 = this->m_chain;
    if (pCVar8 == (Chain *)0x0) goto LAB_0053c1a3;
    iVar20 = (*pCVar8->_vptr_Chain[8])(pCVar8,0);
    this_03 = (_Rb_tree<uint256,std::pair<uint256_const,int>,std::_Select1st<std::pair<uint256_const,int>>,std::less<uint256>,std::allocator<std::pair<uint256_const,int>>>
               *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0);
    if ((char)iVar20 != '\0') {
      uVar25._M_t.
      super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
      ._M_t.
      super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
      .super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>.
      _M_head_impl = (__uniq_ptr_data<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>,_true,_true>
                      )operator_new(0x80);
      *(CWallet **)
       uVar25._M_t.
       super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
       ._M_t.
       super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
       .super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>.
       _M_head_impl = this;
      this_03 = (_Rb_tree<uint256,std::pair<uint256_const,int>,std::_Select1st<std::pair<uint256_const,int>>,std::less<uint256>,std::allocator<std::pair<uint256_const,int>>>
                 *)((long)uVar25._M_t.
                          super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                          .
                          super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
                          ._M_head_impl + 8);
      (((_Rb_tree_header *)
       ((long)uVar25._M_t.
              super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
              ._M_t.
              super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
              .super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
              ._M_head_impl + 0x10))->_M_header)._M_color = _S_red;
      *(_Base_ptr *)
       ((long)uVar25._M_t.
              super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
              ._M_t.
              super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
              .super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
              ._M_head_impl + 0x18) = (_Base_ptr)0x0;
      *(_Base_ptr *)
       ((long)uVar25._M_t.
              super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
              ._M_t.
              super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
              .super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
              ._M_head_impl + 0x20) =
           (_Base_ptr)
           ((long)uVar25._M_t.
                  super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                  .
                  super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
                  ._M_head_impl + 0x10);
      *(_Base_ptr *)
       ((long)uVar25._M_t.
              super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
              ._M_t.
              super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
              .super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
              ._M_head_impl + 0x28) =
           (_Base_ptr)
           ((long)uVar25._M_t.
                  super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                  .
                  super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
                  ._M_head_impl + 0x10);
      *(size_t *)
       ((long)uVar25._M_t.
              super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
              ._M_t.
              super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
              .super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
              ._M_head_impl + 0x30) = 0;
      ByteVectorHash::ByteVectorHash
                ((ByteVectorHash *)
                 ((long)uVar25._M_t.
                        super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                        .
                        super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
                        ._M_head_impl + 0x38));
      *(__node_base_ptr **)
       ((long)uVar25._M_t.
              super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
              ._M_t.
              super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
              .super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
              ._M_head_impl + 0x48) =
           (__node_base_ptr *)
           ((long)uVar25._M_t.
                  super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                  .
                  super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
                  ._M_head_impl + 0x78);
      *(size_type *)
       ((long)uVar25._M_t.
              super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
              ._M_t.
              super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
              .super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
              ._M_head_impl + 0x50) = 1;
      *(undefined1 (*) [16])
       ((long)uVar25._M_t.
              super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
              ._M_t.
              super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
              .super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
              ._M_head_impl + 0x58) = (undefined1  [16])0x0;
      ((_Prime_rehash_policy *)
      ((long)uVar25._M_t.
             super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
             ._M_t.
             super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
             .super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>.
             _M_head_impl + 0x68))->_M_max_load_factor = 1.0;
      *(undefined1 (*) [16])
       ((long)uVar25._M_t.
              super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
              ._M_t.
              super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
              .super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
              ._M_head_impl + 0x70) = (undefined1  [16])0x0;
      if ((*(ulong *)(*(long *)uVar25._M_t.
                               super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                               .
                               super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
                               ._M_head_impl + 0xb0) & 0x400000000) == 0) {
        __assert_fail("!m_wallet.IsLegacy()",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
                      ,0x13d,
                      "wallet::(anonymous namespace)::FastWalletRescanFilter::FastWalletRescanFilter(const CWallet &)"
                     );
      }
      GetAllScriptPubKeyMans
                ((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                  *)&block,
                 *(CWallet **)
                  uVar25._M_t.
                  super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                  .
                  super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
                  ._M_head_impl);
      p_Var5 = (_Rb_tree_node_base *)
               (block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 4);
      if ((_Rb_tree_node_base *)
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._20_8_ !=
          p_Var5) {
        p_Var27 = (_Rb_tree_node_base *)
                  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems.
                  _20_8_;
        do {
          if (*(long *)(p_Var27 + 1) == 0) {
            pDVar26 = (DescriptorScriptPubKeyMan *)0x0;
          }
          else {
            pDVar26 = (DescriptorScriptPubKeyMan *)
                      __dynamic_cast(*(long *)(p_Var27 + 1),&ScriptPubKeyMan::typeinfo,
                                     &DescriptorScriptPubKeyMan::typeinfo,0);
          }
          if (pDVar26 == (DescriptorScriptPubKeyMan *)0x0) {
            __assert_fail("desc_spkm != nullptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
                          ,0x142,
                          "wallet::(anonymous namespace)::FastWalletRescanFilter::FastWalletRescanFilter(const CWallet &)"
                         );
          }
          anon_unknown_48::FastWalletRescanFilter::AddScriptPubKeys
                    ((FastWalletRescanFilter *)
                     uVar25._M_t.
                     super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                     .
                     super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
                     ._M_head_impl,pDVar26,0);
          iVar20 = (*(pDVar26->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[0xc])(pDVar26);
          if ((char)iVar20 != '\0') {
            (*(pDVar26->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[0x1a])((uint256 *)&loc,pDVar26)
            ;
            iVar21 = DescriptorScriptPubKeyMan::GetEndRange(pDVar26);
            end_hash.super_base_blob<256U>.m_data._M_elems[0] = (char)iVar21;
            end_hash.super_base_blob<256U>.m_data._M_elems[1] = (char)((uint)iVar21 >> 8);
            end_hash.super_base_blob<256U>.m_data._M_elems[2] = (char)((uint)iVar21 >> 0x10);
            end_hash.super_base_blob<256U>.m_data._M_elems[3] = (char)((uint)iVar21 >> 0x18);
            std::
            _Rb_tree<uint256,std::pair<uint256_const,int>,std::_Select1st<std::pair<uint256_const,int>>,std::less<uint256>,std::allocator<std::pair<uint256_const,int>>>
            ::_M_emplace_unique<uint256,int>(this_03,(uint256 *)&loc,(int *)&end_hash);
          }
          p_Var27 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var27);
        } while (p_Var27 != p_Var5);
      }
      std::
      _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
      ::~_Rb_tree((_Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                   *)&block);
      uVar18 = fast_rescan_filter;
      tip_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      tip_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      tip_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      tip_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      tip_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      tip_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      tip_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      tip_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      max_height.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>
           = (_Optional_base<int,_true,_true>)(_Optional_base<int,_true,_true>)_Var43;
      if ((__uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
           )fast_rescan_filter._M_t.
            super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
            ._M_t.
            super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
            .super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>.
            _M_head_impl !=
          (__uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
           )0x0) {
        this_00 = (_Hashtable<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::__detail::_Identity,_std::equal_to<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_ByteVectorHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)((long)fast_rescan_filter._M_t.
                            super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                            .
                            super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
                            ._M_head_impl + 0x38);
        fast_rescan_filter._M_t.
        super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
        ._M_t.
        super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
        .super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>.
        _M_head_impl = uVar25._M_t.
                       super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                       .
                       super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
                       ._M_head_impl;
        std::
        _Hashtable<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::__detail::_Identity,_std::equal_to<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_ByteVectorHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable(this_00);
        std::
        _Rb_tree<uint256,_std::pair<const_uint256,_int>,_std::_Select1st<std::pair<const_uint256,_int>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_int>_>_>
        ::~_Rb_tree((_Rb_tree<uint256,_std::pair<const_uint256,_int>,_std::_Select1st<std::pair<const_uint256,_int>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_int>_>_>
                     *)((long)uVar18._M_t.
                              super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                              .
                              super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
                              ._M_head_impl + 8));
        operator_delete((void *)uVar18._M_t.
                                super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                                .
                                super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
                                ._M_head_impl,0x80);
        max_height.super__Optional_base<int,_true,_true>._M_payload.
        super__Optional_payload_base<int> =
             (_Optional_base<int,_true,_true>)(_Optional_base<int,_true,_true>)_Var43;
        uVar25 = fast_rescan_filter;
      }
      fast_rescan_filter._M_t.
      super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
      ._M_t.
      super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
      .super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>.
      _M_head_impl = uVar25._M_t.
                     super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                     .
                     super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
                     ._M_head_impl;
      std::
      unique_ptr<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
      ::~unique_ptr((unique_ptr<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                     *)&tip_hash);
      _Var43 = (_Optional_payload_base<int>)
               max_height.super__Optional_base<int,_true,_true>._M_payload.
               super__Optional_payload_base<int>;
    }
  }
  base_blob<256u>::ToString_abi_cxx11_(&local_78,start_block);
  parameters._M_string_length._0_4_ = (int)this_03;
  parameters._M_dataplus._M_p = (pointer)__return_storage_ptr__;
  parameters._M_string_length._4_4_ = (int)((ulong)this_03 >> 0x20);
  parameters.field_2._M_allocated_capacity._0_4_ = start_height;
  parameters.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffdac;
  parameters.field_2._8_4_ = _Var43._M_payload;
  parameters.field_2._12_1_ = _Var43._M_engaged;
  parameters.field_2._13_3_ = _Var43._5_3_;
  WalletLogPrintf<std::__cxx11::string,char_const*>
            (this,"Rescan started from block %s... (%s)\n",parameters,(char *)&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  LOCK();
  (this->fAbortRescan)._M_base._M_i = false;
  UNLOCK();
  block.super_CBlockHeader._0_8_ =
       block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0xc;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&block,anon_var_dwarf_1da4851,anon_var_dwarf_1da4851 + 0xd);
  pbVar28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            (block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0x1c);
  if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
    block.super_CBlockHeader._32_8_ =
         block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0xc;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)pbVar28,anon_var_dwarf_1da4851,anon_var_dwarf_1da4851 + 0xd);
  }
  else {
    end_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_1da4851;
    (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
              (pbVar28,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&end_hash);
  }
  pbVar28 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                      (pbVar28,0,0,"%s ",3);
  puVar6 = tip_hash.super_base_blob<256U>.m_data._M_elems + 0x10;
  tip_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = (pbVar28->_M_dataplus)._M_p;
  pbVar33 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pbVar28->field_2;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      tip_hash.super_base_blob<256U>.m_data._M_elems._0_8_ == pbVar33) {
    tip_hash.super_base_blob<256U>.m_data._M_elems._16_16_ = *(undefined1 (*) [16])pbVar33;
    tip_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = puVar6;
  }
  else {
    tip_hash.super_base_blob<256U>.m_data._M_elems._16_8_ = *(size_type *)pbVar33;
  }
  tip_hash.super_base_blob<256U>.m_data._M_elems._8_8_ = pbVar28->_M_string_length;
  (pbVar28->_M_dataplus)._M_p = (pointer)pbVar33;
  pbVar28->_M_string_length = 0;
  (pbVar28->field_2)._M_local_buf[0] = '\0';
  GetDisplayName_abi_cxx11_((string *)&end_hash,this);
  tinyformat::format<std::__cxx11::string>
            ((string *)&loc,(tinyformat *)&tip_hash,(string *)&end_hash,pbVar33);
  this_01 = &this->ShowProgress;
  boost::signals2::
  signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_boost::function<void_(const_boost::signals2::connection_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_boost::signals2::mutex>
  ::operator()(this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&loc,0);
  if (loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)&loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
    operator_delete(loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)(((loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage)->
                            super_base_blob<256U>).m_data._M_elems + 1));
  }
  if ((uchar *)end_hash.super_base_blob<256U>.m_data._M_elems._0_8_ !=
      end_hash.super_base_blob<256U>.m_data._M_elems + 0x10) {
    operator_delete((void *)end_hash.super_base_blob<256U>.m_data._M_elems._0_8_,
                    end_hash.super_base_blob<256U>.m_data._M_elems._16_8_ + 1);
  }
  if ((uchar *)tip_hash.super_base_blob<256U>.m_data._M_elems._0_8_ != puVar6) {
    operator_delete((void *)tip_hash.super_base_blob<256U>.m_data._M_elems._0_8_,
                    tip_hash.super_base_blob<256U>.m_data._M_elems._16_8_ + 1);
  }
  if ((uchar *)block.super_CBlockHeader._32_8_ !=
      block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0xc) {
    operator_delete((void *)block.super_CBlockHeader._32_8_,
                    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems.
                    _12_8_ + 1);
  }
  if ((uchar *)block.super_CBlockHeader._0_8_ !=
      block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0xc) {
    operator_delete((void *)block.super_CBlockHeader._0_8_,
                    block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems.
                    _12_8_ + 1);
  }
  pRVar3 = &this->cs_wallet;
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block.super_CBlockHeader._0_8_ = pRVar3;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&block);
  if (this->m_last_block_processed_height < 0) {
    __assert_fail("m_last_block_processed_height >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.h"
                  ,0x3d7,"uint256 wallet::CWallet::GetLastBlockHash() const");
  }
  tip_hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
       *(undefined8 *)(this->m_last_block_processed).super_base_blob<256U>.m_data._M_elems;
  tip_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       *(undefined8 *)((this->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 8);
  tip_hash.super_base_blob<256U>.m_data._M_elems._16_16_ =
       *(undefined1 (*) [16])
        ((this->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 0x10);
  std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)&block);
  end_hash.super_base_blob<256U>.m_data._M_elems[0x10] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x10];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x11] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x11];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x12] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x12];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x13] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x13];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x14] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x14];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x15] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x15];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x16] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x16];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x17] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x17];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x18] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x18];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x19] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x19];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x1a] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x1a];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x1b] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x1b];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x1c] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x1c];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x1d] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x1d];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x1e] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x1e];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x1f] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x1f];
  end_hash.super_base_blob<256U>.m_data._M_elems[0] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0];
  end_hash.super_base_blob<256U>.m_data._M_elems[1] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[1];
  end_hash.super_base_blob<256U>.m_data._M_elems[2] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[2];
  end_hash.super_base_blob<256U>.m_data._M_elems[3] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[3];
  end_hash.super_base_blob<256U>.m_data._M_elems[4] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[4];
  end_hash.super_base_blob<256U>.m_data._M_elems[5] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[5];
  end_hash.super_base_blob<256U>.m_data._M_elems[6] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[6];
  end_hash.super_base_blob<256U>.m_data._M_elems[7] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[7];
  end_hash.super_base_blob<256U>.m_data._M_elems[8] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[8];
  end_hash.super_base_blob<256U>.m_data._M_elems[9] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[9];
  end_hash.super_base_blob<256U>.m_data._M_elems[10] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[10];
  end_hash.super_base_blob<256U>.m_data._M_elems[0xb] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0xb];
  end_hash.super_base_blob<256U>.m_data._M_elems[0xc] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0xc];
  end_hash.super_base_blob<256U>.m_data._M_elems[0xd] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0xd];
  end_hash.super_base_blob<256U>.m_data._M_elems[0xe] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0xe];
  end_hash.super_base_blob<256U>.m_data._M_elems[0xf] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0xf];
  if (((ulong)max_height.super__Optional_base<int,_true,_true>._M_payload.
              super__Optional_payload_base<int> >> 0x20 & 1) != 0) {
    pCVar8 = this->m_chain;
    if (pCVar8 == (Chain *)0x0) goto LAB_0053c1a3;
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    block.super_CBlockHeader.nTime = 0;
    block.super_CBlockHeader.nBits = 0;
    block.super_CBlockHeader.nNonce = 0;
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    block.super_CBlockHeader._0_8_ = (string *)&end_hash;
    (*pCVar8->_vptr_Chain[0xc])
              (pCVar8,&tip_hash,
               (ulong)max_height.super__Optional_base<int,_true,_true>._M_payload.
                      super__Optional_payload_base<int> & 0xffffffff);
  }
  pCVar8 = this->m_chain;
  if (pCVar8 == (Chain *)0x0) goto LAB_0053c1a3;
  (*pCVar8->_vptr_Chain[0x10])(pCVar8,&block_hash);
  pCVar8 = this->m_chain;
  if (pCVar8 == (Chain *)0x0) goto LAB_0053c1a3;
  (*pCVar8->_vptr_Chain[0x10])(pCVar8,&end_hash);
  pNVar2 = &reserver->m_now;
  uVar41 = SUB84(extraout_XMM0_Qa,0);
  uVar42 = (undefined4)((ulong)extraout_XMM0_Qa >> 0x20);
  args = __return_storage_ptr__;
  block_height = start_height;
  if (((this->fAbortRescan)._M_base._M_i & 1U) == 0) {
    if (this->m_chain == (Chain *)0x0) goto LAB_0053c1a3;
    iVar20 = (*this->m_chain->_vptr_Chain[0x24])();
    if ((char)iVar20 == '\0') {
      dVar36 = extraout_XMM0_Qa_00 - extraout_XMM0_Qa;
      if (0.0 < dVar36) {
        dVar37 = ((double)CONCAT44(uVar42,uVar41) - extraout_XMM0_Qa) / dVar36;
      }
      else {
        dVar37 = 0.0;
      }
      LOCK();
      (this->m_scanning_progress).super___atomic_float<double>._M_fp = dVar37;
      UNLOCK();
      puVar6 = next_block_hash.super_base_blob<256U>.m_data._M_elems + 0x10;
      pbVar28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0x1c
                );
      if ((0.0 < dVar36) && (block_height == (block_height / 100) * 100)) {
        block.super_CBlockHeader._0_8_ =
             block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0xc;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&block,anon_var_dwarf_1da4851,anon_var_dwarf_1da4851 + 0xd);
        if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
          block.super_CBlockHeader._32_8_ =
               block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0xc;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)pbVar28,anon_var_dwarf_1da4851,anon_var_dwarf_1da4851 + 0xd);
        }
        else {
          criticalblock43.super_unique_lock._M_device = (mutex_type *)anon_var_dwarf_1da4851;
          (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                    (pbVar28,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&criticalblock43);
        }
        pbVar28 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  replace(pbVar28,0,0,"%s ",3);
        next_block_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = (pbVar28->_M_dataplus)._M_p;
        pbVar33 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &pbVar28->field_2;
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            next_block_hash.super_base_blob<256U>.m_data._M_elems._0_8_ == pbVar33) {
          next_block_hash.super_base_blob<256U>.m_data._M_elems._16_8_ = *(undefined8 *)pbVar33;
          next_block_hash.super_base_blob<256U>.m_data._M_elems._24_8_ =
               *(undefined8 *)((long)&pbVar28->field_2 + 8);
          next_block_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = puVar6;
        }
        else {
          next_block_hash.super_base_blob<256U>.m_data._M_elems._16_8_ = *(undefined8 *)pbVar33;
        }
        next_block_hash.super_base_blob<256U>.m_data._M_elems._8_8_ = pbVar28->_M_string_length;
        (pbVar28->_M_dataplus)._M_p = (pointer)pbVar33;
        pbVar28->_M_string_length = 0;
        (pbVar28->field_2)._M_local_buf[0] = '\0';
        GetDisplayName_abi_cxx11_((string *)&criticalblock43,this);
        tinyformat::format<std::__cxx11::string>
                  ((string *)&loc,(tinyformat *)&next_block_hash,(string *)&criticalblock43,pbVar33)
        ;
        iVar20 = (int)((this->m_scanning_progress).super___atomic_float<double>._M_fp * 100.0);
        if (0x62 < iVar20) {
          iVar20 = 99;
        }
        if (iVar20 < 2) {
          iVar20 = 1;
        }
        boost::signals2::
        signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_boost::function<void_(const_boost::signals2::connection_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_boost::signals2::mutex>
        ::operator()(this_01,(string *)&loc,iVar20);
        if (loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Vector_impl_data._M_start !=
            (pointer)&loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
          operator_delete(loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (ulong)(((loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->
                                  super_base_blob<256U>).m_data._M_elems + 1));
        }
        if (criticalblock43.super_unique_lock._M_device != (mutex_type *)local_e8) {
          operator_delete(criticalblock43.super_unique_lock._M_device,local_e8._0_8_ + 1);
        }
        if ((uchar *)next_block_hash.super_base_blob<256U>.m_data._M_elems._0_8_ != puVar6) {
          operator_delete((void *)next_block_hash.super_base_blob<256U>.m_data._M_elems._0_8_,
                          next_block_hash.super_base_blob<256U>.m_data._M_elems._16_8_ + 1);
        }
        if ((uchar *)block.super_CBlockHeader._32_8_ !=
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0xc) {
          operator_delete((void *)block.super_CBlockHeader._32_8_,
                          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data.
                          _M_elems._12_8_ + 1);
        }
        if ((uchar *)block.super_CBlockHeader._0_8_ !=
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0xc) {
          operator_delete((void *)block.super_CBlockHeader._0_8_,
                          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data.
                          _M_elems._12_8_ + 1);
        }
      }
      if ((reserver->m_now).super__Function_base._M_manager == (_Manager_type)0x0) {
        tVar29.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
        max_height.super__Optional_base<int,_true,_true>._M_payload.
        super__Optional_payload_base<int> =
             (_Optional_base<int,_true,_true>)(_Optional_base<int,_true,_true>)_Var43;
      }
      else {
        tVar29 = (*(reserver->m_now)._M_invoker)((_Any_data *)pNVar2);
        max_height.super__Optional_base<int,_true,_true>._M_payload.
        super__Optional_payload_base<int> =
             (_Optional_base<int,_true,_true>)(_Optional_base<int,_true,_true>)_Var43;
      }
      uVar40 = (undefined4)((ulong)this_03 >> 0x20);
      lVar4 = (long)tVar23.__d.__r + 60000000000;
      if (lVar4 <= (long)tVar29.__d.__r) {
        if ((reserver->m_now).super__Function_base._M_manager == (_Manager_type)0x0) {
          std::chrono::_V2::steady_clock::now();
          uVar40 = (undefined4)((ulong)this_03 >> 0x20);
        }
        else {
          (*(reserver->m_now)._M_invoker)((_Any_data *)pNVar2);
        }
        WalletLogPrintf<int,double>
                  (this,"Still rescanning. At block %d. Progress=%f\n",block_height,
                   (double)CONCAT44(uVar42,uVar41));
        tVar23.__d.__r = (duration)(duration)extraout_RAX;
      }
      uVar25._M_t.
      super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
      ._M_t.
      super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
      .super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>.
      _M_head_impl = fast_rescan_filter._M_t.
                     super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                     .
                     super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
                     ._M_head_impl;
      uVar39 = (undefined4)CONCAT71((int7)((ulong)tVar23.__d.__r >> 8),1);
      _Var43 = (_Optional_payload_base<int>)
               max_height.super__Optional_base<int,_true,_true>._M_payload.
               super__Optional_payload_base<int>;
      if ((__uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
           )fast_rescan_filter._M_t.
            super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
            ._M_t.
            super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
            .super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>.
            _M_head_impl !=
          (__uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
           )0x0) {
        p_Var27 = *(_Rb_tree_node_base **)
                   ((long)fast_rescan_filter._M_t.
                          super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                          .
                          super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
                          ._M_head_impl + 0x20);
        p_Var5 = (_Rb_tree_node_base *)
                 ((long)fast_rescan_filter._M_t.
                        super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                        .
                        super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
                        ._M_head_impl + 0x10);
        if (p_Var27 != p_Var5) {
          this_02 = (map<uint256,_int,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_int>_>_>
                     *)((long)fast_rescan_filter._M_t.
                              super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                              .
                              super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
                              ._M_head_impl + 8);
          do {
            pSVar30 = GetScriptPubKeyMan(*(CWallet **)
                                          uVar25._M_t.
                                          super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                                          .
                                          super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
                                          ._M_head_impl,(uint256 *)(p_Var27 + 1));
            if (pSVar30 == (ScriptPubKeyMan *)0x0) {
              pDVar26 = (DescriptorScriptPubKeyMan *)0x0;
            }
            else {
              pDVar26 = (DescriptorScriptPubKeyMan *)
                        __dynamic_cast(pSVar30,&ScriptPubKeyMan::typeinfo,
                                       &DescriptorScriptPubKeyMan::typeinfo,0);
            }
            if (pDVar26 == (DescriptorScriptPubKeyMan *)0x0) {
              __assert_fail("desc_spkm != nullptr",
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
                            ,0x150,
                            "void wallet::(anonymous namespace)::FastWalletRescanFilter::UpdateIfNeeded()"
                           );
            }
            iVar21 = DescriptorScriptPubKeyMan::GetEndRange(pDVar26);
            if ((int)p_Var27[2]._M_color < iVar21) {
              anon_unknown_48::FastWalletRescanFilter::AddScriptPubKeys
                        ((FastWalletRescanFilter *)
                         uVar25._M_t.
                         super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                         .
                         super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
                         ._M_head_impl,pDVar26,p_Var27[2]._M_color);
              (*(pDVar26->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[0x1a])(&block,pDVar26);
              pmVar31 = std::
                        map<uint256,_int,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_int>_>_>
                        ::at(this_02,(key_type *)&block);
              *pmVar31 = iVar21;
            }
            p_Var27 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var27);
          } while (p_Var27 != p_Var5);
        }
        plVar9 = *(long **)(*(long *)fast_rescan_filter._M_t.
                                     super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                                     .
                                     super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
                                     ._M_head_impl + 0xb8);
        if (plVar9 == (long *)0x0) goto LAB_0053c1a3;
        uVar22 = (**(code **)(*plVar9 + 0x48))
                           (plVar9,0,&block_hash,
                            (long)fast_rescan_filter._M_t.
                                  super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                                  .
                                  super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
                                  ._M_head_impl + 0x38);
        _Var43 = (_Optional_payload_base<int>)
                 max_height.super__Optional_base<int,_true,_true>._M_payload.
                 super__Optional_payload_base<int>;
        if ((uVar22 >> 8 & 1) == 0) {
          pLVar32 = LogInstance();
          bVar19 = BCLog::Logger::WillLogCategoryLevel(pLVar32,SCAN,Debug);
          if (bVar19) {
            base_blob<256u>::ToString_abi_cxx11_((string *)&block,&block_hash);
            logging_function._M_str = "ScanForWalletTransactions";
            logging_function._M_len = 0x19;
            source_file._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
            ;
            source_file._M_len = 0x5a;
            LogPrintf_<int,std::__cxx11::string>
                      (logging_function,source_file,0x78b,
                       IPC|COINDB|LIBEVENT|PROXY|RAND|CMPCTBLOCK|REINDEX|SELECTCOINS|ADDRMAN|
                       ESTIMATEFEE|ZMQ|BENCH|HTTP,(Level)&block_height,(char *)&block,(int *)args,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(uVar40,uVar39));
LAB_0053b722:
            if ((uchar *)block.super_CBlockHeader._0_8_ !=
                block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0xc)
            {
              operator_delete((void *)block.super_CBlockHeader._0_8_,
                              block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data.
                              _M_elems._12_8_ + 1);
            }
          }
        }
        else if ((uVar22 & 1) == 0) {
          auVar11[8] = block_hash.super_base_blob<256U>.m_data._M_elems[0x18];
          auVar11[9] = block_hash.super_base_blob<256U>.m_data._M_elems[0x19];
          auVar11[10] = block_hash.super_base_blob<256U>.m_data._M_elems[0x1a];
          auVar11[0xb] = block_hash.super_base_blob<256U>.m_data._M_elems[0x1b];
          auVar11[0xc] = block_hash.super_base_blob<256U>.m_data._M_elems[0x1c];
          auVar11[0xd] = block_hash.super_base_blob<256U>.m_data._M_elems[0x1d];
          auVar11[0xe] = block_hash.super_base_blob<256U>.m_data._M_elems[0x1e];
          auVar11[0xf] = block_hash.super_base_blob<256U>.m_data._M_elems[0x1f];
          auVar11[0] = block_hash.super_base_blob<256U>.m_data._M_elems[0x10];
          auVar11[1] = block_hash.super_base_blob<256U>.m_data._M_elems[0x11];
          auVar11[2] = block_hash.super_base_blob<256U>.m_data._M_elems[0x12];
          auVar11[3] = block_hash.super_base_blob<256U>.m_data._M_elems[0x13];
          auVar11[4] = block_hash.super_base_blob<256U>.m_data._M_elems[0x14];
          auVar11[5] = block_hash.super_base_blob<256U>.m_data._M_elems[0x15];
          auVar11[6] = block_hash.super_base_blob<256U>.m_data._M_elems[0x16];
          auVar11[7] = block_hash.super_base_blob<256U>.m_data._M_elems[0x17];
          *(undefined1 (*) [16])
           ((__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems +
           0x10) = auVar11;
          *(undefined8 *)
           (__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems =
               block_hash.super_base_blob<256U>.m_data._M_elems._0_8_;
          *(undefined8 *)
           ((__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems + 8)
               = block_hash.super_base_blob<256U>.m_data._M_elems._8_8_;
          (args->last_scanned_height).super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int> =
               (_Optional_payload_base<int>)((ulong)(uint)block_height | 0x100000000);
          uVar39 = 0;
        }
        else {
          pLVar32 = LogInstance();
          bVar19 = BCLog::Logger::WillLogCategoryLevel(pLVar32,SCAN,Debug);
          if (bVar19) {
            base_blob<256u>::ToString_abi_cxx11_((string *)&block,&block_hash);
            logging_function_00._M_str = "ScanForWalletTransactions";
            logging_function_00._M_len = 0x19;
            source_file_00._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
            ;
            source_file_00._M_len = 0x5a;
            LogPrintf_<int,std::__cxx11::string>
                      (logging_function_00,source_file_00,0x784,
                       IPC|COINDB|LIBEVENT|PROXY|RAND|CMPCTBLOCK|REINDEX|SELECTCOINS|ADDRMAN|
                       ESTIMATEFEE|TOR|NET,(Level)&block_height,(char *)&block,(int *)args,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(uVar40,uVar39));
            goto LAB_0053b722;
          }
        }
      }
      cVar38 = (char)uVar39;
      block_still_active = false;
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      pCVar8 = this->m_chain;
      if (pCVar8 == (Chain *)0x0) goto LAB_0053c1a3;
      block.super_CBlockHeader._64_16_ = ZEXT816(0);
      block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._12_16_ =
           ZEXT816(0);
      block.super_CBlockHeader._0_16_ = ZEXT816(0);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = &block_still_active;
      block.super_CBlockHeader._32_16_ = auVar15 << 0x40;
      loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start = &next_block_hash;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = &loc;
      block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._12_16_ =
           auVar16 << 0x40;
      (*pCVar8->_vptr_Chain[10])(pCVar8,&block_hash,&block);
      if (cVar38 != '\0') {
        block.super_CBlockHeader._0_16_ = ZEXT816(0);
        block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._12_16_ =
             ZEXT816(0);
        block.super_CBlockHeader._32_16_ = ZEXT816(0);
        block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._12_16_ =
             ZEXT816(0);
        block.super_CBlockHeader._64_16_ = ZEXT816(0);
        block.vtx.
        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        block.vtx.
        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        block.vtx.
        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        block.fChecked = false;
        block.m_checked_witness_commitment = false;
        block.m_checked_merkle_root = false;
        pCVar8 = this->m_chain;
        if (pCVar8 == (Chain *)0x0) goto LAB_0053c1a3;
        loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        max_height.super__Optional_base<int,_true,_true>._M_payload.
        super__Optional_payload_base<int> =
             (_Optional_base<int,_true,_true>)(_Optional_base<int,_true,_true>)_Var43;
        (*pCVar8->_vptr_Chain[10])(pCVar8,&block_hash,&loc);
        if (block.super_CBlockHeader.nBits == 0) {
          auVar13[8] = block_hash.super_base_blob<256U>.m_data._M_elems[0x18];
          auVar13[9] = block_hash.super_base_blob<256U>.m_data._M_elems[0x19];
          auVar13[10] = block_hash.super_base_blob<256U>.m_data._M_elems[0x1a];
          auVar13[0xb] = block_hash.super_base_blob<256U>.m_data._M_elems[0x1b];
          auVar13[0xc] = block_hash.super_base_blob<256U>.m_data._M_elems[0x1c];
          auVar13[0xd] = block_hash.super_base_blob<256U>.m_data._M_elems[0x1d];
          auVar13[0xe] = block_hash.super_base_blob<256U>.m_data._M_elems[0x1e];
          auVar13[0xf] = block_hash.super_base_blob<256U>.m_data._M_elems[0x1f];
          auVar13[0] = block_hash.super_base_blob<256U>.m_data._M_elems[0x10];
          auVar13[1] = block_hash.super_base_blob<256U>.m_data._M_elems[0x11];
          auVar13[2] = block_hash.super_base_blob<256U>.m_data._M_elems[0x12];
          auVar13[3] = block_hash.super_base_blob<256U>.m_data._M_elems[0x13];
          auVar13[4] = block_hash.super_base_blob<256U>.m_data._M_elems[0x14];
          auVar13[5] = block_hash.super_base_blob<256U>.m_data._M_elems[0x15];
          auVar13[6] = block_hash.super_base_blob<256U>.m_data._M_elems[0x16];
          auVar13[7] = block_hash.super_base_blob<256U>.m_data._M_elems[0x17];
          *(undefined1 (*) [16])
           ((__return_storage_ptr__->last_failed_block).super_base_blob<256U>.m_data._M_elems + 0x10
           ) = auVar13;
          *(undefined8 *)
           (__return_storage_ptr__->last_failed_block).super_base_blob<256U>.m_data._M_elems =
               block_hash.super_base_blob<256U>.m_data._M_elems._0_8_;
          *(undefined8 *)
           ((__return_storage_ptr__->last_failed_block).super_base_blob<256U>.m_data._M_elems + 8) =
               block_hash.super_base_blob<256U>.m_data._M_elems._8_8_;
          args->status = FAILURE;
        }
        else {
          criticalblock43.super_unique_lock._M_owns = false;
          _Var43 = (_Optional_payload_base<int>)
                   max_height.super__Optional_base<int,_true,_true>._M_payload.
                   super__Optional_payload_base<int>;
          criticalblock43.super_unique_lock._M_device = &pRVar3->super_recursive_mutex;
          std::unique_lock<std::recursive_mutex>::lock(&criticalblock43.super_unique_lock);
          if (block_still_active == true) {
            max_height.super__Optional_base<int,_true,_true>._M_payload.
            super__Optional_payload_base<int> =
                 (_Optional_base<int,_true,_true>)(_Optional_base<int,_true,_true>)_Var43;
            if (block.vtx.
                super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                block.vtx.
                super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              lVar34 = 0;
              uVar35 = 0;
              do {
                ptx = (CTransactionRef *)
                      ((long)&((block.vtx.
                                super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr + lVar34);
                loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_start =
                     (pointer)block_hash.super_base_blob<256U>.m_data._M_elems._0_8_;
                loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     (pointer)block_hash.super_base_blob<256U>.m_data._M_elems._8_8_;
                loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage =
                     (pointer)block_hash.super_base_blob<256U>.m_data._M_elems._16_8_;
                bVar19 = AddToWalletIfInvolvingMe(this,ptx,(SyncTxState *)&loc,fUpdate,true);
                if (bVar19) {
                  MarkInputsDirty(this,ptx);
                }
                uVar35 = uVar35 + 1;
                lVar34 = lVar34 + 0x10;
              } while (uVar35 < (ulong)((long)block.vtx.
                                              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)block.vtx.
                                              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start >> 4));
            }
            auVar12[8] = block_hash.super_base_blob<256U>.m_data._M_elems[0x18];
            auVar12[9] = block_hash.super_base_blob<256U>.m_data._M_elems[0x19];
            auVar12[10] = block_hash.super_base_blob<256U>.m_data._M_elems[0x1a];
            auVar12[0xb] = block_hash.super_base_blob<256U>.m_data._M_elems[0x1b];
            auVar12[0xc] = block_hash.super_base_blob<256U>.m_data._M_elems[0x1c];
            auVar12[0xd] = block_hash.super_base_blob<256U>.m_data._M_elems[0x1d];
            auVar12[0xe] = block_hash.super_base_blob<256U>.m_data._M_elems[0x1e];
            auVar12[0xf] = block_hash.super_base_blob<256U>.m_data._M_elems[0x1f];
            auVar12[0] = block_hash.super_base_blob<256U>.m_data._M_elems[0x10];
            auVar12[1] = block_hash.super_base_blob<256U>.m_data._M_elems[0x11];
            auVar12[2] = block_hash.super_base_blob<256U>.m_data._M_elems[0x12];
            auVar12[3] = block_hash.super_base_blob<256U>.m_data._M_elems[0x13];
            auVar12[4] = block_hash.super_base_blob<256U>.m_data._M_elems[0x14];
            auVar12[5] = block_hash.super_base_blob<256U>.m_data._M_elems[0x15];
            auVar12[6] = block_hash.super_base_blob<256U>.m_data._M_elems[0x16];
            auVar12[7] = block_hash.super_base_blob<256U>.m_data._M_elems[0x17];
            *(undefined1 (*) [16])
             ((__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems +
             0x10) = auVar12;
            *(undefined8 *)
             (__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems =
                 block_hash.super_base_blob<256U>.m_data._M_elems._0_8_;
            *(undefined8 *)
             ((__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems + 8
             ) = block_hash.super_base_blob<256U>.m_data._M_elems._8_8_;
            (args->last_scanned_height).super__Optional_base<int,_true,_true>._M_payload.
            super__Optional_payload_base<int> =
                 (_Optional_payload_base<int>)((ulong)(uint)block_height | 0x100000000);
            if (save_progress && lVar4 <= (long)tVar29.__d.__r) {
              (*this->m_chain->_vptr_Chain[6])(&loc,this->m_chain,&block_hash);
              if (loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_start !=
                  loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                WalletLogPrintf<int>(this,"Saving scan progress %d.\n",block_height);
                pWVar10 = (this->m_database)._M_t.
                          super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
                          .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
                if (pWVar10 == (WalletDatabase *)0x0) {
                  __assert_fail("static_cast<bool>(m_database)",
                                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.h"
                                ,0x1be,
                                "virtual WalletDatabase &wallet::CWallet::GetDatabase() const");
                }
                (*pWVar10->_vptr_WalletDatabase[0xe])(&batch,pWVar10,1);
                batch.m_database = pWVar10;
                WalletBatch::WriteBestBlock(&batch,&loc);
                if ((__uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                     )batch.m_batch._M_t.
                      super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                      .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
                    (__uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                     )0x0) {
                  (**(code **)(*(long *)batch.m_batch._M_t.
                                        super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                                        .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>.
                                        _M_head_impl + 0x28))();
                }
              }
              if (loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)loc.vHave.
                                      super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage -
                                (long)loc.vHave.
                                      super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                                      super__Vector_impl_data._M_start);
              }
            }
          }
          else {
            auVar14[8] = block_hash.super_base_blob<256U>.m_data._M_elems[0x18];
            auVar14[9] = block_hash.super_base_blob<256U>.m_data._M_elems[0x19];
            auVar14[10] = block_hash.super_base_blob<256U>.m_data._M_elems[0x1a];
            auVar14[0xb] = block_hash.super_base_blob<256U>.m_data._M_elems[0x1b];
            auVar14[0xc] = block_hash.super_base_blob<256U>.m_data._M_elems[0x1c];
            auVar14[0xd] = block_hash.super_base_blob<256U>.m_data._M_elems[0x1d];
            auVar14[0xe] = block_hash.super_base_blob<256U>.m_data._M_elems[0x1e];
            auVar14[0xf] = block_hash.super_base_blob<256U>.m_data._M_elems[0x1f];
            auVar14[0] = block_hash.super_base_blob<256U>.m_data._M_elems[0x10];
            auVar14[1] = block_hash.super_base_blob<256U>.m_data._M_elems[0x11];
            auVar14[2] = block_hash.super_base_blob<256U>.m_data._M_elems[0x12];
            auVar14[3] = block_hash.super_base_blob<256U>.m_data._M_elems[0x13];
            auVar14[4] = block_hash.super_base_blob<256U>.m_data._M_elems[0x14];
            auVar14[5] = block_hash.super_base_blob<256U>.m_data._M_elems[0x15];
            auVar14[6] = block_hash.super_base_blob<256U>.m_data._M_elems[0x16];
            auVar14[7] = block_hash.super_base_blob<256U>.m_data._M_elems[0x17];
            *(undefined1 (*) [16])
             ((__return_storage_ptr__->last_failed_block).super_base_blob<256U>.m_data._M_elems +
             0x10) = auVar14;
            *(undefined8 *)
             (__return_storage_ptr__->last_failed_block).super_base_blob<256U>.m_data._M_elems =
                 block_hash.super_base_blob<256U>.m_data._M_elems._0_8_;
            *(undefined8 *)
             ((__return_storage_ptr__->last_failed_block).super_base_blob<256U>.m_data._M_elems + 8)
                 = block_hash.super_base_blob<256U>.m_data._M_elems._8_8_;
            args->status = FAILURE;
          }
          std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock43.super_unique_lock);
        }
        std::
        vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ::~vector(&block.vtx);
      }
    }
  }
  puVar6 = next_block_hash.super_base_blob<256U>.m_data._M_elems + 0x10;
  if (((ulong)max_height.super__Optional_base<int,_true,_true>._M_payload.
              super__Optional_payload_base<int> & 0x100000000) == 0) {
    WalletLogPrintf<>(this,"Scanning current mempool transactions.\n");
    block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    block.super_CBlockHeader._0_8_ = pRVar3;
    std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&block);
    pCVar8 = this->m_chain;
    if (pCVar8 == (Chain *)0x0) goto LAB_0053c1a3;
    (*pCVar8->_vptr_Chain[0x34])(pCVar8,&this->super_Notifications);
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)&block);
  }
  block.super_CBlockHeader._0_8_ =
       block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0xc;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&block,anon_var_dwarf_1da4851,anon_var_dwarf_1da4851 + 0xd);
  pbVar28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            (block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0x1c);
  if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
    block.super_CBlockHeader._32_8_ =
         block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0xc;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)pbVar28,anon_var_dwarf_1da4851,anon_var_dwarf_1da4851 + 0xd);
  }
  else {
    criticalblock43.super_unique_lock._M_device = (mutex_type *)anon_var_dwarf_1da4851;
    (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
              (pbVar28,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&criticalblock43);
  }
  pbVar28 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                      (pbVar28,0,0,"%s ",3);
  next_block_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = (pbVar28->_M_dataplus)._M_p;
  pbVar33 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pbVar28->field_2;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      next_block_hash.super_base_blob<256U>.m_data._M_elems._0_8_ == pbVar33) {
    next_block_hash.super_base_blob<256U>.m_data._M_elems._16_8_ = *(undefined8 *)pbVar33;
    next_block_hash.super_base_blob<256U>.m_data._M_elems._24_8_ =
         *(undefined8 *)((long)&pbVar28->field_2 + 8);
    next_block_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = puVar6;
  }
  else {
    next_block_hash.super_base_blob<256U>.m_data._M_elems._16_8_ = *(undefined8 *)pbVar33;
  }
  next_block_hash.super_base_blob<256U>.m_data._M_elems._8_8_ = pbVar28->_M_string_length;
  (pbVar28->_M_dataplus)._M_p = (pointer)pbVar33;
  pbVar28->_M_string_length = 0;
  (pbVar28->field_2)._M_local_buf[0] = '\0';
  GetDisplayName_abi_cxx11_((string *)&criticalblock43,this);
  tinyformat::format<std::__cxx11::string>
            ((string *)&loc,(tinyformat *)&next_block_hash,(string *)&criticalblock43,pbVar33);
  boost::signals2::
  signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_boost::function<void_(const_boost::signals2::connection_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_boost::signals2::mutex>
  ::operator()(this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&loc,100
              );
  if (loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)&loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
    operator_delete(loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)(((loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage)->
                            super_base_blob<256U>).m_data._M_elems + 1));
  }
  if (criticalblock43.super_unique_lock._M_device != (mutex_type *)local_e8) {
    operator_delete(criticalblock43.super_unique_lock._M_device,local_e8._0_8_ + 1);
  }
  if ((uchar *)next_block_hash.super_base_blob<256U>.m_data._M_elems._0_8_ != puVar6) {
    operator_delete((void *)next_block_hash.super_base_blob<256U>.m_data._M_elems._0_8_,
                    next_block_hash.super_base_blob<256U>.m_data._M_elems._16_8_ + 1);
  }
  if ((uchar *)block.super_CBlockHeader._32_8_ !=
      block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0xc) {
    operator_delete((void *)block.super_CBlockHeader._32_8_,
                    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems.
                    _12_8_ + 1);
  }
  if ((uchar *)block.super_CBlockHeader._0_8_ !=
      block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0xc) {
    operator_delete((void *)block.super_CBlockHeader._0_8_,
                    block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems.
                    _12_8_ + 1);
  }
  if ((block_height == 0) || (((this->fAbortRescan)._M_base._M_i & 1U) == 0)) {
    if (block_height != 0) {
      if (this->m_chain == (Chain *)0x0) {
LAB_0053c1a3:
        __assert_fail("m_chain",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.h"
                      ,0x1f5,"interfaces::Chain &wallet::CWallet::chain() const");
      }
      iVar20 = (*this->m_chain->_vptr_Chain[0x24])();
      if ((char)iVar20 != '\0') {
        fmt = "Rescan interrupted by shutdown request at block %d. Progress=%f\n";
        goto LAB_0053c044;
      }
    }
    if ((reserver->m_now).super__Function_base._M_manager == (_Manager_type)0x0) {
      tVar23.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    }
    else {
      tVar23 = (*(reserver->m_now)._M_invoker)((_Any_data *)pNVar2);
    }
    WalletLogPrintf<long>
              (this,"Rescan completed in %15dms\n",
               ((long)tVar23.__d.__r - (long)tVar24.__d.__r) / 1000000);
  }
  else {
    fmt = "Rescan aborted at block %d. Progress=%f\n";
LAB_0053c044:
    WalletLogPrintf<int,double>(this,fmt,block_height,(double)CONCAT44(uVar42,uVar41));
    args->status = USER_ABORT;
  }
  std::
  unique_ptr<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
  ::~unique_ptr(&fast_rescan_filter);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar7) {
    return args;
  }
  __stack_chk_fail();
}

Assistant:

CWallet::ScanResult CWallet::ScanForWalletTransactions(const uint256& start_block, int start_height, std::optional<int> max_height, const WalletRescanReserver& reserver, bool fUpdate, const bool save_progress)
{
    constexpr auto INTERVAL_TIME{60s};
    auto current_time{reserver.now()};
    auto start_time{reserver.now()};

    assert(reserver.isReserved());

    uint256 block_hash = start_block;
    ScanResult result;

    std::unique_ptr<FastWalletRescanFilter> fast_rescan_filter;
    if (!IsLegacy() && chain().hasBlockFilterIndex(BlockFilterType::BASIC)) fast_rescan_filter = std::make_unique<FastWalletRescanFilter>(*this);

    WalletLogPrintf("Rescan started from block %s... (%s)\n", start_block.ToString(),
                    fast_rescan_filter ? "fast variant using block filters" : "slow variant inspecting all blocks");

    fAbortRescan = false;
    ShowProgress(strprintf("%s " + _("Rescanning…").translated, GetDisplayName()), 0); // show rescan progress in GUI as dialog or on splashscreen, if rescan required on startup (e.g. due to corruption)
    uint256 tip_hash = WITH_LOCK(cs_wallet, return GetLastBlockHash());
    uint256 end_hash = tip_hash;
    if (max_height) chain().findAncestorByHeight(tip_hash, *max_height, FoundBlock().hash(end_hash));
    double progress_begin = chain().guessVerificationProgress(block_hash);
    double progress_end = chain().guessVerificationProgress(end_hash);
    double progress_current = progress_begin;
    int block_height = start_height;
    while (!fAbortRescan && !chain().shutdownRequested()) {
        if (progress_end - progress_begin > 0.0) {
            m_scanning_progress = (progress_current - progress_begin) / (progress_end - progress_begin);
        } else { // avoid divide-by-zero for single block scan range (i.e. start and stop hashes are equal)
            m_scanning_progress = 0;
        }
        if (block_height % 100 == 0 && progress_end - progress_begin > 0.0) {
            ShowProgress(strprintf("%s " + _("Rescanning…").translated, GetDisplayName()), std::max(1, std::min(99, (int)(m_scanning_progress * 100))));
        }

        bool next_interval = reserver.now() >= current_time + INTERVAL_TIME;
        if (next_interval) {
            current_time = reserver.now();
            WalletLogPrintf("Still rescanning. At block %d. Progress=%f\n", block_height, progress_current);
        }

        bool fetch_block{true};
        if (fast_rescan_filter) {
            fast_rescan_filter->UpdateIfNeeded();
            auto matches_block{fast_rescan_filter->MatchesBlock(block_hash)};
            if (matches_block.has_value()) {
                if (*matches_block) {
                    LogDebug(BCLog::SCAN, "Fast rescan: inspect block %d [%s] (filter matched)\n", block_height, block_hash.ToString());
                } else {
                    result.last_scanned_block = block_hash;
                    result.last_scanned_height = block_height;
                    fetch_block = false;
                }
            } else {
                LogDebug(BCLog::SCAN, "Fast rescan: inspect block %d [%s] (WARNING: block filter not found!)\n", block_height, block_hash.ToString());
            }
        }

        // Find next block separately from reading data above, because reading
        // is slow and there might be a reorg while it is read.
        bool block_still_active = false;
        bool next_block = false;
        uint256 next_block_hash;
        chain().findBlock(block_hash, FoundBlock().inActiveChain(block_still_active).nextBlock(FoundBlock().inActiveChain(next_block).hash(next_block_hash)));

        if (fetch_block) {
            // Read block data
            CBlock block;
            chain().findBlock(block_hash, FoundBlock().data(block));

            if (!block.IsNull()) {
                LOCK(cs_wallet);
                if (!block_still_active) {
                    // Abort scan if current block is no longer active, to prevent
                    // marking transactions as coming from the wrong block.
                    result.last_failed_block = block_hash;
                    result.status = ScanResult::FAILURE;
                    break;
                }
                for (size_t posInBlock = 0; posInBlock < block.vtx.size(); ++posInBlock) {
                    SyncTransaction(block.vtx[posInBlock], TxStateConfirmed{block_hash, block_height, static_cast<int>(posInBlock)}, fUpdate, /*rescanning_old_block=*/true);
                }
                // scan succeeded, record block as most recent successfully scanned
                result.last_scanned_block = block_hash;
                result.last_scanned_height = block_height;

                if (save_progress && next_interval) {
                    CBlockLocator loc = m_chain->getActiveChainLocator(block_hash);

                    if (!loc.IsNull()) {
                        WalletLogPrintf("Saving scan progress %d.\n", block_height);
                        WalletBatch batch(GetDatabase());
                        batch.WriteBestBlock(loc);
                    }
                }
            } else {
                // could not scan block, keep scanning but record this block as the most recent failure
                result.last_failed_block = block_hash;
                result.status = ScanResult::FAILURE;
            }
        }
        if (max_height && block_height >= *max_height) {
            break;
        }
        {
            if (!next_block) {
                // break successfully when rescan has reached the tip, or
                // previous block is no longer on the chain due to a reorg
                break;
            }

            // increment block and verification progress
            block_hash = next_block_hash;
            ++block_height;
            progress_current = chain().guessVerificationProgress(block_hash);

            // handle updated tip hash
            const uint256 prev_tip_hash = tip_hash;
            tip_hash = WITH_LOCK(cs_wallet, return GetLastBlockHash());
            if (!max_height && prev_tip_hash != tip_hash) {
                // in case the tip has changed, update progress max
                progress_end = chain().guessVerificationProgress(tip_hash);
            }
        }
    }
    if (!max_height) {
        WalletLogPrintf("Scanning current mempool transactions.\n");
        WITH_LOCK(cs_wallet, chain().requestMempoolTransactions(*this));
    }
    ShowProgress(strprintf("%s " + _("Rescanning…").translated, GetDisplayName()), 100); // hide progress dialog in GUI
    if (block_height && fAbortRescan) {
        WalletLogPrintf("Rescan aborted at block %d. Progress=%f\n", block_height, progress_current);
        result.status = ScanResult::USER_ABORT;
    } else if (block_height && chain().shutdownRequested()) {
        WalletLogPrintf("Rescan interrupted by shutdown request at block %d. Progress=%f\n", block_height, progress_current);
        result.status = ScanResult::USER_ABORT;
    } else {
        WalletLogPrintf("Rescan completed in %15dms\n", Ticks<std::chrono::milliseconds>(reserver.now() - start_time));
    }
    return result;
}